

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void * Curl_hash_add(curl_hash *h,void *key,size_t key_len,void *p)

{
  curl_llist **ppcVar1;
  curl_llist *list;
  int iVar2;
  size_t sVar3;
  curl_hash_element *p_00;
  curl_llist *l;
  curl_llist_element *le;
  curl_hash_element *he;
  void *p_local;
  size_t key_len_local;
  void *key_local;
  curl_hash *h_local;
  
  ppcVar1 = h->table;
  sVar3 = (*h->hash_func)(key,key_len,(long)h->slots);
  list = ppcVar1[sVar3];
  l = (curl_llist *)list->head;
  do {
    if (l == (curl_llist *)0x0) {
LAB_00877b94:
      p_00 = mk_hash_element(key,key_len,p);
      if (p_00 != (curl_hash_element *)0x0) {
        iVar2 = Curl_llist_insert_next(list,list->tail,p_00);
        if (iVar2 != 0) {
          h->size = h->size + 1;
          return p;
        }
        (*Curl_cfree)(p_00->key);
        (*Curl_cfree)(p_00);
      }
      return (void *)0x0;
    }
    sVar3 = (*h->comp_func)(l->head->prev,(size_t)l->head->next,key,key_len);
    if (sVar3 != 0) {
      Curl_llist_remove(list,(curl_llist_element *)l,h);
      h->size = h->size - 1;
      goto LAB_00877b94;
    }
    l = (curl_llist *)l->dtor;
  } while( true );
}

Assistant:

void *
Curl_hash_add(struct curl_hash *h, void *key, size_t key_len, void *p)
{
  struct curl_hash_element  *he;
  struct curl_llist_element *le;
  struct curl_llist *l = FETCH_LIST (h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = (struct curl_hash_element *) le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *)h);
      --h->size;
      break;
    }
  }

  he = mk_hash_element(key, key_len, p);
  if(he) {
    if(Curl_llist_insert_next(l, l->tail, he)) {
      ++h->size;
      return p; /* return the new entry */
    }
    /*
     * Couldn't insert it, destroy the 'he' element and the key again. We
     * don't call hash_element_dtor() since that would also call the
     * "destructor" for the actual data 'p'. When we fail, we shall not touch
     * that data.
     */
    free(he->key);
    free(he);
  }

  return NULL; /* failure */
}